

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

Bool OptionValueIdentical(TidyOptionImpl *option,TidyOptionValue *val1,TidyOptionValue *val2)

{
  int iVar1;
  TidyOptionValue *val2_local;
  TidyOptionValue *val1_local;
  TidyOptionImpl *option_local;
  
  if (option->type == TidyString) {
    if (val1->v == val2->v) {
      option_local._4_4_ = yes;
    }
    else if ((val1->v == 0) || (val2->v == 0)) {
      option_local._4_4_ = no;
    }
    else {
      iVar1 = prvTidytmbstrcmp(val1->p,val2->p);
      option_local._4_4_ = (Bool)(iVar1 == 0);
    }
  }
  else {
    option_local._4_4_ = (Bool)(val1->v == val2->v);
  }
  return option_local._4_4_;
}

Assistant:

static Bool OptionValueIdentical( const TidyOptionImpl* option,
                                  const TidyOptionValue* val1,
                                  const TidyOptionValue* val2 )
{
    if ( option->type == TidyString )
    {
        if ( val1->p == val2->p )
            return yes;
        if ( !val1->p || !val2->p )
            return no;
        return TY_(tmbstrcmp)( val1->p, val2->p ) == 0;
    }
    else
        return val1->v == val2->v;
}